

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

void aom_fft8x8_float_c(float *input,float *temp,float *output)

{
  ulong uVar1;
  int y;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int x;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  lVar7 = 0;
  do {
    aom_fft1d_8_float((float *)((long)input + lVar7),(float *)((long)output + lVar7),8);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x20);
  lVar7 = 0;
  pfVar2 = temp;
  pfVar3 = output;
  do {
    lVar4 = 0;
    do {
      *(float *)((long)pfVar2 + lVar4) = pfVar3[lVar4 * 2];
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x20);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    pfVar2 = pfVar2 + 8;
  } while (lVar7 != 8);
  lVar7 = 0;
  do {
    aom_fft1d_8_float((float *)((long)temp + lVar7),(float *)((long)output + lVar7),8);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x20);
  lVar7 = 0;
  pfVar2 = temp;
  pfVar3 = output;
  do {
    lVar4 = 0;
    do {
      *(float *)((long)pfVar2 + lVar4) = pfVar3[lVar4 * 2];
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x20);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    pfVar2 = pfVar2 + 8;
  } while (lVar7 != 8);
  pfVar10 = temp + 0x24;
  pfVar2 = output + 0x80;
  lVar7 = 0x80;
  lVar4 = 0;
  lVar5 = 0;
  pfVar3 = output;
  do {
    uVar1 = lVar5 - 1;
    uVar6 = 0xffffffffffffffff;
    lVar11 = 0;
    lVar8 = 0;
    do {
      fVar12 = *(float *)((long)pfVar10 + lVar11 * 2 + -0x90);
      if (2 < uVar6 || 2 < uVar1) {
        pfVar3[lVar11] = fVar12;
        if (uVar1 < 3) {
          lVar9 = (lVar8 + lVar5 * 8) * 2;
          goto LAB_0048dfe5;
        }
        lVar9 = lVar4 + lVar11;
        fVar12 = 0.0;
      }
      else {
        lVar9 = lVar4 + lVar11;
        pfVar3[lVar11] = fVar12 - *(float *)((long)pfVar10 + lVar11 * 2);
LAB_0048dfe5:
        fVar12 = *(float *)((long)pfVar10 + lVar11 * 2 + -0x10);
      }
      fVar13 = 0.0;
      if (uVar6 < 3) {
        fVar13 = *(float *)((long)pfVar10 + lVar11 * 2 + -0x80);
      }
      output[lVar9 + 1] = fVar12 + fVar13;
      if (uVar1 < 3) {
        fVar12 = *(float *)((long)pfVar10 + lVar11 * 2 + -0x90);
        if (2 < uVar6 || 2 < uVar1) {
          fVar13 = 0.0;
          pfVar2[lVar11] = fVar12 + 0.0;
          fVar12 = *(float *)((long)pfVar10 + lVar11 * 2 + -0x10);
          if (uVar6 < 3) {
            lVar9 = lVar8 * 2 + lVar5 * -0x10 + 0x80;
            goto LAB_0048e063;
          }
          lVar9 = lVar7 + lVar11;
        }
        else {
          lVar9 = lVar7 + lVar11;
          pfVar2[lVar11] = fVar12 + *(float *)((long)pfVar10 + lVar11 * 2);
          fVar12 = *(float *)((long)pfVar10 + lVar11 * 2 + -0x10);
LAB_0048e063:
          fVar13 = *(float *)((long)pfVar10 + lVar11 * 2 + -0x80);
        }
        output[lVar9 + 1] = fVar13 - fVar12;
      }
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 2;
      uVar6 = uVar6 + 1;
    } while (lVar11 != 10);
    lVar5 = lVar5 + 1;
    pfVar10 = pfVar10 + 8;
    lVar7 = lVar7 + -0x10;
    pfVar2 = pfVar2 + -0x10;
    lVar4 = lVar4 + 0x10;
    pfVar3 = pfVar3 + 0x10;
    if (lVar5 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void aom_fft8x8_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 8, aom_fft1d_8_float, simple_transpose,
                 unpack_2d_output, 1);
}